

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_RegExpDelete(JSContext *ctx,JSValue this_val,JSValue arg)

{
  JSValue JVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t iVar7;
  JSObject *p;
  uint32_t from;
  JSRefCountHeader *p_1;
  uint8_t *cbuf;
  uint32_t to;
  uint32_t from_00;
  ulong uVar8;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue val;
  int end;
  int64_t local_a0;
  uint8_t **local_98;
  JSValueUnion local_90;
  uint32_t local_84;
  int64_t local_80;
  int local_74;
  uint8_t *local_70;
  uint8_t *local_68;
  ulong local_60;
  StringBuffer local_58;
  ulong local_38;
  JSValueUnion p_00;
  
  local_80 = this_val.tag;
  JVar11.u = this_val.u;
  if (((int)this_val.tag == -1) && (*(short *)((long)JVar11.u.ptr + 6) == 0x12)) {
    local_58.len = 0;
    local_58.size = 0;
    local_58.is_wide_char = 0;
    local_58.error_status = 0;
    local_58.ctx = ctx;
    local_58.str = js_alloc_string(ctx,0,0);
    if (local_58.str == (JSString *)0x0) {
      local_58._16_8_ = local_58._16_8_ & 0xffffffff;
      local_58.error_status = -1;
    }
    v = JS_ToStringInternal(ctx,arg,0);
    p_00 = v.u;
    if ((uint)v.tag == 6) {
LAB_00140d0e:
      local_98 = (uint8_t **)0x0;
    }
    else {
      local_68 = (uint8_t *)(*(long *)((long)JVar11.u.ptr + 0x38) + 0x10);
      uVar2 = lre_get_flags(local_68);
      if ((uVar2 & 0x21) == 0) {
        local_60 = 0;
      }
      else {
        JVar11.tag = local_80;
        JVar9.tag = local_80;
        JVar9.u.ptr = JVar11.u.ptr;
        JVar9 = JS_GetPropertyInternal(ctx,JVar11,0x55,JVar9,0);
        if (((int)JVar9.tag == 6) ||
           (iVar3 = JS_ToLengthFree(ctx,(int64_t *)&local_60,JVar9), iVar3 != 0)) goto LAB_00140d0e;
      }
      uVar4 = lre_get_capture_count(local_68);
      if ((int)uVar4 < 1) {
        local_98 = (uint8_t **)0x0;
      }
      else {
        local_98 = (uint8_t **)js_malloc(ctx,(ulong)uVar4 << 4);
        if (local_98 == (uint8_t **)0x0) {
          local_98 = (uint8_t **)0x0;
          goto LAB_00140d11;
        }
      }
      uVar5 = *(ulong *)((long)p_00.ptr + 4);
      from_00 = 0;
      if ((long)local_60 <= (long)(ulong)((uint)uVar5 & 0x7fffffff)) {
        local_38 = uVar5 >> 0x1f & 1;
        cbuf = (uint8_t *)((long)p_00.ptr + 0x10);
        local_74 = (int)local_38;
        uVar8 = 0;
        uVar6 = local_60;
        local_70 = cbuf;
        do {
          iVar3 = lre_exec(local_98,local_68,cbuf,(int)uVar6,(uint)uVar5 & 0x7fffffff,local_74,ctx);
          from = (uint32_t)uVar8;
          local_90 = p_00;
          JVar1 = v;
          if (iVar3 != 1) {
            if (iVar3 < 0) {
              JS_ThrowInternalError(ctx,"out of memory in regexp execution");
              goto LAB_00140d11;
            }
            if (((uVar2 & 0x21) != 0) || (from_00 = from, iVar3 == 2)) {
              this_obj_00.tag = local_80;
              this_obj_00.u.ptr = JVar11.u.ptr;
              iVar3 = JS_SetPropertyInternal(ctx,this_obj_00,0x55,(JSValue)ZEXT816(0),0x4000);
LAB_00140f88:
              from_00 = from;
              if (iVar3 < 0) goto LAB_00140fb4;
            }
            break;
          }
          uVar8 = (long)local_98[1] - (long)cbuf >> ((byte)local_38 & 0x3f);
          from_00 = (uint32_t)uVar8;
          to = (uint32_t)((long)*local_98 - (long)cbuf >> ((byte)local_38 & 0x3f));
          local_84 = from_00;
          if (((int)from < (int)to) &&
             (iVar3 = string_buffer_concat(&local_58,(JSString *)p_00.ptr,from,to), cbuf = local_70,
             iVar3 != 0)) goto LAB_00140fb4;
          if ((uVar2 & 1) == 0) {
            val.u = uVar8 & 0xffffffff;
            this_obj.tag = local_80;
            this_obj.u.ptr = JVar11.u.ptr;
            val.tag = 0;
            iVar3 = JS_SetPropertyInternal(ctx,this_obj,0x55,val,0x4000);
            from = from_00;
            goto LAB_00140f88;
          }
          uVar6 = uVar8 & 0xffffffff;
          if (from_00 == to) {
            if ((((uVar2 & 0x10) == 0) || (-1 < (int)*(uint *)((long)p_00.ptr + 4))) ||
               ((*(uint *)((long)p_00.ptr + 4) & 0x7fffffff) <= to)) {
              local_84 = to + 1;
              uVar6 = (ulong)local_84;
            }
            else {
              string_getc((JSString *)p_00.ptr,(int *)&local_84);
              uVar6 = (ulong)local_84;
              cbuf = local_70;
            }
          }
          uVar5 = *(ulong *)((long)p_00.ptr + 4);
        } while ((long)(int)uVar6 <= (long)(ulong)((uint)uVar5 & 0x7fffffff));
      }
      JVar1.tag = v.tag;
      JVar1.u.float64 = local_90.float64;
      iVar3 = string_buffer_concat
                        (&local_58,(JSString *)p_00.ptr,from_00,
                         *(uint *)((long)p_00.ptr + 4) & 0x7fffffff);
      if (iVar3 == 0) {
        if ((0xfffffff4 < (uint)v.tag) &&
           (iVar3 = *p_00.ptr, *(int *)p_00.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,v);
        }
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_98);
        JVar11 = string_buffer_end(&local_58);
        iVar7 = JVar11.tag;
        uVar6 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar11.u._0_4_;
        goto LAB_00140d71;
      }
LAB_00140fb4:
      local_a0 = JVar1.tag;
      v.tag = local_a0;
      v.u.float64 = p_00.float64;
    }
LAB_00140d11:
    if ((0xfffffff4 < (uint)v.tag) && (iVar3 = *v.u.ptr, *(int *)v.u.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_98);
    (*((local_58.ctx)->rt->mf).js_free)(&(local_58.ctx)->rt->malloc_state,local_58.str);
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x12);
  }
  iVar7 = 6;
  uVar5 = 0;
  uVar6 = 0;
LAB_00140d71:
  JVar10.u.ptr = (void *)(uVar5 | uVar6);
  JVar10.tag = iVar7;
  return JVar10;
}

Assistant:

static JSValue JS_RegExpDelete(JSContext *ctx, JSValueConst this_val, JSValueConst arg)
{
    JSRegExp *re = js_get_regexp(ctx, this_val, TRUE);
    JSString *str;
    JSValue str_val, val;
    uint8_t *re_bytecode;
    int ret;
    uint8_t **capture, *str_buf;
    int capture_count, shift, re_flags;
    int next_src_pos, start, end;
    int64_t last_index;
    StringBuffer b_s, *b = &b_s;

    if (!re)
        return JS_EXCEPTION;

    string_buffer_init(ctx, b, 0);

    capture = NULL;
    str_val = JS_ToString(ctx, arg);
    if (JS_IsException(str_val))
        goto fail;
    str = JS_VALUE_GET_STRING(str_val);
    re_bytecode = re->bytecode->u.str8;
    re_flags = lre_get_flags(re_bytecode);
    if ((re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY)) == 0) {
        last_index = 0;
    } else {
        val = JS_GetProperty(ctx, this_val, JS_ATOM_lastIndex);
        if (JS_IsException(val) || JS_ToLengthFree(ctx, &last_index, val))
            goto fail;
    }
    capture_count = lre_get_capture_count(re_bytecode);
    if (capture_count > 0) {
        capture = js_malloc(ctx, sizeof(capture[0]) * capture_count * 2);
        if (!capture)
            goto fail;
    }
    shift = str->is_wide_char;
    str_buf = str->u.str8;
    next_src_pos = 0;
    for (;;) {
        if (last_index > str->len)
            break;

        ret = lre_exec(capture, re_bytecode,
                       str_buf, last_index, str->len, shift, ctx);
        if (ret != 1) {
            if (ret >= 0) {
                if (ret == 2 || (re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY))) {
                    if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                                       JS_NewInt32(ctx, 0)) < 0)
                        goto fail;
                }
            } else {
                JS_ThrowInternalError(ctx, "out of memory in regexp execution");
                goto fail;
            }
            break;
        }
        start = (capture[0] - str_buf) >> shift;
        end = (capture[1] - str_buf) >> shift;
        last_index = end;
        if (next_src_pos < start) {
            if (string_buffer_concat(b, str, next_src_pos, start))
                goto fail;
        }
        next_src_pos = end;
        if (!(re_flags & LRE_FLAG_GLOBAL)) {
            if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                               JS_NewInt32(ctx, end)) < 0)
                goto fail;
            break;
        }
        if (end == start) {
            if (!(re_flags & LRE_FLAG_UTF16) || (unsigned)end >= str->len || !str->is_wide_char) {
                end++;
            } else {
                string_getc(str, &end);
            }
        }
        last_index = end;
    }
    if (string_buffer_concat(b, str, next_src_pos, str->len))
        goto fail;
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    return string_buffer_end(b);
fail:
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    string_buffer_free(b);
    return JS_EXCEPTION;
}